

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileRemote.cpp
# Opt level: O2

void __thiscall adios2::transport::FileRemote::~FileRemote(FileRemote *this)

{
  (this->super_Transport)._vptr_Transport = (_func_int **)&PTR__FileRemote_008242a0;
  if ((this->super_Transport).m_IsOpen == true) {
    Close(this);
  }
  std::__cxx11::string::~string((string *)&this->m_CachePath);
  std::__cxx11::string::~string((string *)&this->m_FileName);
  std::__cxx11::string::~string((string *)&this->m_Hostname);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_OpenFuture).super___basic_future<int>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::unique_ptr<adios2::Remote,_std::default_delete<adios2::Remote>_>::~unique_ptr
            (&this->m_Remote);
  Transport::~Transport(&this->super_Transport);
  return;
}

Assistant:

FileRemote::~FileRemote()
{
    if (m_IsOpen)
    {
        Close();
    }
}